

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

ostream * __thiscall cppcms::http::response::out(response *this)

{
  long lVar1;
  _data *p_Var2;
  undefined8 uVar3;
  cached_settings *pcVar4;
  reference ppeVar5;
  hold_ptr<cppcms::http::response::_data> *in_RDI;
  undefined1 auVar6 [12];
  int buffer;
  int level;
  bool gzip;
  size_t bsize_1;
  size_t bsize;
  string *in_stack_fffffffffffffe78;
  response *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffe88;
  list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
  *in_stack_fffffffffffffe90;
  gzip_buf *this_00;
  context *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffeb8;
  response *this_01;
  locale local_e0 [8];
  locale local_d8 [8];
  hold_ptr<cppcms::http::context::_data> local_d0;
  undefined4 in_stack_ffffffffffffff38;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff3c;
  int __oflag;
  undefined1 local_b1 [40];
  byte local_89;
  output_device *local_88;
  char local_80 [16];
  long local_70;
  async_io_buf *local_68;
  char local_60 [16];
  long local_50;
  undefined1 local_45;
  session_interface *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [40];
  ostream *local_8;
  
  if ((*(uint *)((long)&in_RDI[3].ptr_ + 4) >> 1 & 1) == 0) {
    if ((*(uint *)((long)&in_RDI[3].ptr_ + 4) >> 3 & 1) != 0) {
      local_45 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_30,"Request for output stream for finalized request is illegal",&local_31);
      cppcms_error::cppcms_error
                ((cppcms_error *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      local_45 = 0;
      __cxa_throw(uVar3,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
    }
    if ((*(int *)&in_RDI[3].ptr_ == 3) || (*(int *)&in_RDI[3].ptr_ == 4)) {
      http::context::service((context *)0x399fc5);
      pcVar4 = service::cached_settings((service *)0x399fcd);
      local_50 = (long)(pcVar4->service).async_output_buffer_size;
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      if (p_Var2->required_buffer_size != -1) {
        p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
        local_50 = (long)p_Var2->required_buffer_size;
      }
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      std::weak_ptr<cppcms::impl::cgi::connection>::weak_ptr
                ((weak_ptr<cppcms::impl::cgi::connection> *)in_stack_fffffffffffffe80,
                 (weak_ptr<cppcms::impl::cgi::connection> *)in_stack_fffffffffffffe78);
      details::basic_device::open(&(p_Var2->buffered).super_basic_device,local_60,(int)local_50);
      std::weak_ptr<cppcms::impl::cgi::connection>::~weak_ptr
                ((weak_ptr<cppcms::impl::cgi::connection> *)0x39a07c);
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      lVar1 = *(long *)(*(long *)&p_Var2->output + -0x18);
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      std::ios::rdbuf((streambuf *)(&p_Var2->output + lVar1));
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      local_68 = &p_Var2->buffered;
      std::__cxx11::
      list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
      ::push_front(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      if (*(int *)&in_RDI[3].ptr_ == 4) {
        p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
        details::basic_device::raw_mode(&(p_Var2->buffered).super_basic_device,true);
      }
    }
    else {
      http::context::service((context *)0x39a176);
      pcVar4 = service::cached_settings((service *)0x39a17e);
      local_70 = (long)(pcVar4->service).output_buffer_size;
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      if (p_Var2->required_buffer_size != -1) {
        p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
        local_70 = (long)p_Var2->required_buffer_size;
      }
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      std::weak_ptr<cppcms::impl::cgi::connection>::weak_ptr
                ((weak_ptr<cppcms::impl::cgi::connection> *)in_stack_fffffffffffffe80,
                 (weak_ptr<cppcms::impl::cgi::connection> *)in_stack_fffffffffffffe78);
      details::basic_device::open(&(p_Var2->output_buf).super_basic_device,local_80,(int)local_70);
      std::weak_ptr<cppcms::impl::cgi::connection>::~weak_ptr
                ((weak_ptr<cppcms::impl::cgi::connection> *)0x39a223);
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      lVar1 = *(long *)(*(long *)&p_Var2->output + -0x18);
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      std::ios::rdbuf((streambuf *)(&p_Var2->output + lVar1));
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      local_88 = &p_Var2->output_buf;
      std::__cxx11::
      list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
      ::push_front(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      if (*(int *)&in_RDI[3].ptr_ == 2) {
        p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
        details::basic_device::raw_mode(&(p_Var2->output_buf).super_basic_device,true);
      }
    }
    *(uint *)((long)&in_RDI[3].ptr_ + 4) = *(uint *)((long)&in_RDI[3].ptr_ + 4) & 0xfffffffd | 2;
    local_89 = need_gzip((response *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if ((bool)local_89) {
      this_01 = (response *)local_b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_b1 + 1),"gzip",(allocator *)this_01);
      content_encoding(this_01,in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string((string *)(local_b1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_b1);
    }
    if ((*(int *)&in_RDI[3].ptr_ != 2) && (*(int *)&in_RDI[3].ptr_ != 4)) {
      http::context::session(in_stack_fffffffffffffea0);
      session_interface::save(in_stack_ffffffffffffffc0);
      write_http_headers(in_stack_fffffffffffffe80);
    }
    if ((*(uint *)((long)&in_RDI[3].ptr_ + 4) >> 2 & 1) != 0) {
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      auVar6 = std::ios::rdbuf();
      details::copy_buf::open(&p_Var2->cached,auVar6._0_8_,auVar6._8_4_);
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      lVar1 = *(long *)(*(long *)&p_Var2->output + -0x18);
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      std::ios::rdbuf((streambuf *)(&p_Var2->output + lVar1));
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      std::__cxx11::
      list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
      ::push_front(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    if ((local_89 & 1) != 0) {
      http::context::service((context *)0x39a536);
      pcVar4 = service::cached_settings((service *)0x39a53e);
      __oflag = (pcVar4->gzip).level;
      http::context::service((context *)0x39a55f);
      pcVar4 = service::cached_settings((service *)0x39a567);
      uVar7 = (pcVar4->gzip).buffer;
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      this_00 = &p_Var2->zbuf;
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      ppeVar5 = std::__cxx11::
                list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
                ::front((list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
                         *)in_stack_fffffffffffffe80);
      details::gzip_buf::open(this_00,(char *)*ppeVar5,__oflag,(ulong)uVar7);
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      lVar1 = *(long *)(*(long *)&p_Var2->output + -0x18);
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      std::ios::rdbuf((streambuf *)(&p_Var2->output + lVar1));
      booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
      local_d0.ptr_ = (_data *)&p_Var2->zbuf;
      std::__cxx11::
      list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
      ::push_front((list<cppcms::http::details::extended_streambuf_*,_std::allocator<cppcms::http::details::extended_streambuf_*>_>
                    *)this_00,in_stack_fffffffffffffe88);
    }
    booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
    http::context::locale((context *)local_e0);
    std::ios::imbue(local_d8);
    std::locale::~locale(local_d8);
    std::locale::~locale(local_e0);
    p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
  }
  else {
    p_Var2 = booster::hold_ptr<cppcms::http::response::_data>::operator->(in_RDI);
  }
  local_8 = &p_Var2->output;
  return local_8;
}

Assistant:

std::ostream &response::out()
{
	if(ostream_requested_)
		return d->output;

	if(finalized_)
		throw cppcms_error("Request for output stream for finalized request is illegal");
	
	if(io_mode_ == asynchronous || io_mode_ == asynchronous_raw)  {
		size_t bsize = context_.service().cached_settings().service.async_output_buffer_size;
		if(d->required_buffer_size != -1)
			bsize = d->required_buffer_size;
		d->buffered.open(d->conn,bsize);
		d->output.rdbuf(&d->buffered);
		d->buffers.push_front(&d->buffered);
		if(io_mode_ == asynchronous_raw)
			d->buffered.raw_mode(true);
	}
	else { 
		size_t bsize = context_.service().cached_settings().service.output_buffer_size;
		if(d->required_buffer_size != -1)
			bsize = d->required_buffer_size;
		d->output_buf.open(d->conn,bsize);
		d->output.rdbuf(&d->output_buf);
		d->buffers.push_front(&d->output_buf);
		if(io_mode_ == raw)
			d->output_buf.raw_mode(true);
	}
	
	ostream_requested_=1;
	
	#ifndef CPPCMS_NO_GZIP
	bool gzip = need_gzip();
	
	if(gzip) {
		content_encoding("gzip");
	}
	#endif

	// Now we shoulde write headers -- before comrpession
	if(io_mode_ != raw && io_mode_ != asynchronous_raw) {
		context_.session().save();
		write_http_headers();
	}
	
	if(copy_to_cache_) {
		d->cached.open(d->output.rdbuf());
		d->output.rdbuf(&d->cached);
		d->buffers.push_front(&d->cached);
	}
	
	#ifndef CPPCMS_NO_GZIP
	if(gzip) {
		int level=context_.service().cached_settings().gzip.level;
		int buffer=context_.service().cached_settings().gzip.buffer;
		d->zbuf.open(d->buffers.front(),level,buffer);
		d->output.rdbuf(&d->zbuf);
		d->buffers.push_front(&d->zbuf);
	}
	#endif
	
	d->output.imbue(context_.locale());
	return d->output;
}